

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

void tree_sitter_gdscript_external_scanner_destroy(void *payload)

{
  free(*(void **)(*payload + 8));
  free(*(void **)(*(long *)((long)payload + 8) + 8));
  free(*payload);
  free(*(void **)((long)payload + 8));
  free(payload);
  return;
}

Assistant:

void tree_sitter_gdscript_external_scanner_destroy(void *payload) {
    Scanner *scanner = (Scanner *)payload;
    VEC_FREE(scanner->indents);
    VEC_FREE(scanner->delimiters);
    free(scanner->indents);
    free(scanner->delimiters);
    free(scanner);
}